

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O3

void __thiscall Liby::UdpSocket::handleWritEvent(UdpSocket *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Buffer *this_01;
  element_type *peVar1;
  _Head_base<0UL,_std::function<void_()>_*,_false> _Var2;
  char *__buf;
  size_t __n;
  ssize_t sVar3;
  off_t oVar4;
  _Elt_pointer puVar5;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  this_00 = (this->self_).super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_38 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/UdpSocket.cpp:64:17)>
             ::_M_invoke;
  local_50._8_8_ = 0;
  local_40 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/UdpSocket.cpp:64:17)>
             ::_M_manager;
  local_50._M_unused._M_object = this;
  DeferCaller::~DeferCaller((DeferCaller *)&local_50);
  puVar5 = (this->writTasks_).
           super__Deque_base<Liby::udp_io_task,_std::allocator<Liby::udp_io_task>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  if ((this->writTasks_).super__Deque_base<Liby::udp_io_task,_std::allocator<Liby::udp_io_task>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_cur != puVar5) {
    do {
      this_01 = (puVar5->buffer_).super___shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      peVar1 = (this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      __buf = Buffer::data(this_01);
      __n = Buffer::size(this_01);
      sVar3 = sendto(peVar1->fd_,__buf,__n,0,(sockaddr *)puVar5->dest_,0x10);
      if ((int)(uint)sVar3 < 0) {
        handleErroEvent(this);
        break;
      }
      Buffer::retrieve(this_01,(ulong)((uint)sVar3 & 0x7fffffff));
      oVar4 = Buffer::size(this_01);
      if (oVar4 == 0) {
        _Var2._M_head_impl =
             (puVar5->handler_)._M_t.
             super___uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::function<void_()>_*,_std::default_delete<std::function<void_()>_>_>
             .super__Head_base<0UL,_std::function<void_()>_*,_false>._M_head_impl;
        if (((_Any_data *)_Var2._M_head_impl != (_Any_data *)0x0) &&
           (*(long *)&((_Var2._M_head_impl)->super__Function_base)._M_manager != 0)) {
          (*(_Var2._M_head_impl)->_M_invoker)((_Any_data *)_Var2._M_head_impl);
        }
        std::deque<Liby::udp_io_task,_std::allocator<Liby::udp_io_task>_>::pop_front
                  (&this->writTasks_);
      }
      puVar5 = (this->writTasks_).
               super__Deque_base<Liby::udp_io_task,_std::allocator<Liby::udp_io_task>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
    } while ((this->writTasks_).
             super__Deque_base<Liby::udp_io_task,_std::allocator<Liby::udp_io_task>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur != puVar5);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void UdpSocket::handleWritEvent() {
    auto self = self_;
    DeferCaller([this] {
        if (destroy_)
            return;
        if (writTasks_.empty())
            enableWrit(false);
    });

    while (!writTasks_.empty()) {
        auto &first = writTasks_.front();
        auto &buffer = *(first.buffer_);

        int n = socket_->sendto(buffer.data(), buffer.size(), 0,
                                (struct sockaddr *)first.dest_,
                                sizeof(struct sockaddr_in));

        if (n < 0) {
            if (n != EAGAIN) {
                handleErroEvent();
            }
            break;
        }

        buffer.retrieve(n);
        if (buffer.size() == 0) {
            if (first.handler_ && *(first.handler_))
                (*first.handler_)();
            writTasks_.pop_front();
        }
    }
}